

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void r4k_fill_tlb(CPUMIPSState_conflict5 *env,int idx)

{
  ulong uVar1;
  ulong *puVar2;
  uint64_t uVar3;
  uint64_t mask;
  r4k_tlb_t_conflict *tlb;
  int idx_local;
  CPUMIPSState_conflict5 *env_local;
  
  uVar1 = (ulong)(env->CP0_PageMask >> 0xd);
  puVar2 = (ulong *)((long)&env->tlb->mmu + (long)idx * 0x28);
  if ((env->CP0_EntryHi & 0x400) == 0) {
    *(ushort *)((long)puVar2 + 0x14) = *(ushort *)((long)puVar2 + 0x14) & 0x7fff;
    *puVar2 = env->CP0_EntryHi & 0xffffffffffffe000;
    *puVar2 = env->SEGMask & *puVar2;
    *(ushort *)((long)puVar2 + 0xc) = (ushort)env->CP0_EntryHi & (ushort)env->CP0_EntryHi_ASID_mask;
    *(int32_t *)(puVar2 + 2) = env->CP0_MemoryMapID;
    *(int32_t *)(puVar2 + 1) = env->CP0_PageMask;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xfffe |
         (ushort)env->CP0_EntryLo0 & (ushort)env->CP0_EntryLo1 & 1;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xff7f | (ushort)((env->CP0_EntryLo0 & 2) != 0) << 7;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xfdff | (ushort)((env->CP0_EntryLo0 & 4) != 0) << 9;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xfff1 | ((ushort)(env->CP0_EntryLo0 >> 3) & 7) << 1;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xf7ff |
         ((ushort)(env->CP0_EntryLo0 >> 0x3e) & 1) << 0xb;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xdfff | (ushort)(env->CP0_EntryLo0 >> 0x3f) << 0xd;
    uVar3 = get_tlb_pfn_from_entrylo(env->CP0_EntryLo0);
    puVar2[3] = (uVar3 & (uVar1 ^ 0xffffffffffffffff)) << 0xc;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xfeff | (ushort)((env->CP0_EntryLo1 & 2) != 0) << 8;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xfbff | (ushort)((env->CP0_EntryLo1 & 4) != 0) << 10;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xff8f | ((ushort)(env->CP0_EntryLo1 >> 3) & 7) << 4;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xefff |
         ((ushort)(env->CP0_EntryLo1 >> 0x3e) & 1) << 0xc;
    *(ushort *)((long)puVar2 + 0x14) =
         *(ushort *)((long)puVar2 + 0x14) & 0xbfff | (ushort)(env->CP0_EntryLo1 >> 0x3f) << 0xe;
    uVar3 = get_tlb_pfn_from_entrylo(env->CP0_EntryLo1);
    puVar2[4] = (uVar3 & (uVar1 ^ 0xffffffffffffffff)) << 0xc;
  }
  else {
    *(ushort *)((long)puVar2 + 0x14) = *(ushort *)((long)puVar2 + 0x14) & 0x7fff | 0x8000;
  }
  return;
}

Assistant:

static void r4k_fill_tlb(CPUMIPSState *env, int idx)
{
    r4k_tlb_t *tlb;
    uint64_t mask = env->CP0_PageMask >> (TARGET_PAGE_BITS + 1);

    /* XXX: detect conflicting TLBs and raise a MCHECK exception when needed */
    tlb = &env->tlb->mmu.r4k.tlb[idx];
    if (env->CP0_EntryHi & (1 << CP0EnHi_EHINV)) {
        tlb->EHINV = 1;
        return;
    }
    tlb->EHINV = 0;
    tlb->VPN = env->CP0_EntryHi & (TARGET_PAGE_MASK << 1);
#if defined(TARGET_MIPS64)
    tlb->VPN &= env->SEGMask;
#endif
    tlb->ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    tlb->MMID = env->CP0_MemoryMapID;
    tlb->PageMask = env->CP0_PageMask;
    tlb->G = env->CP0_EntryLo0 & env->CP0_EntryLo1 & 1;
    tlb->V0 = (env->CP0_EntryLo0 & 2) != 0;
    tlb->D0 = (env->CP0_EntryLo0 & 4) != 0;
    tlb->C0 = (env->CP0_EntryLo0 >> 3) & 0x7;
    tlb->XI0 = (env->CP0_EntryLo0 >> CP0EnLo_XI) & 1;
    tlb->RI0 = (env->CP0_EntryLo0 >> CP0EnLo_RI) & 1;
    tlb->PFN[0] = (get_tlb_pfn_from_entrylo(env->CP0_EntryLo0) & ~mask) << 12;
    tlb->V1 = (env->CP0_EntryLo1 & 2) != 0;
    tlb->D1 = (env->CP0_EntryLo1 & 4) != 0;
    tlb->C1 = (env->CP0_EntryLo1 >> 3) & 0x7;
    tlb->XI1 = (env->CP0_EntryLo1 >> CP0EnLo_XI) & 1;
    tlb->RI1 = (env->CP0_EntryLo1 >> CP0EnLo_RI) & 1;
    tlb->PFN[1] = (get_tlb_pfn_from_entrylo(env->CP0_EntryLo1) & ~mask) << 12;
}